

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp_image.h
# Opt level: O1

bmp_header bmp_image::read_bmp_header(istream *input)

{
  bmp_header bVar1;
  bmp_header result;
  undefined8 local_28;
  undefined8 uStack_20;
  
  local_28 = 0;
  uStack_20 = 0;
  std::istream::read((char *)input,(long)&local_28);
  std::istream::read((char *)input,(long)&local_28 + 4);
  std::istream::read((char *)input,(long)&uStack_20);
  std::istream::read((char *)input,(long)&uStack_20 + 4);
  bVar1.reserved = (undefined4)uStack_20;
  bVar1.offset = uStack_20._4_4_;
  bVar1.magic = (undefined2)local_28;
  bVar1._2_2_ = local_28._2_2_;
  bVar1.file_size = local_28._4_4_;
  return bVar1;
}

Assistant:

static bmp_header read_bmp_header(std::istream& input)
    {
        bmp_header result{};

        read(input, result.magic);
        read(input, result.file_size);
        read(input, result.reserved);
        read(input, result.offset);

        return result;
    }